

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O0

void ImTui_ImplNcurses_Shutdown(void)

{
  TScreen *pTVar1;
  TScreen *unaff_retaddr;
  
  printf("\x1b[?1003l\n");
  endwin();
  pTVar1 = g_screen;
  if ((g_screen != (TScreen *)0x0) && (g_screen != (TScreen *)0x0)) {
    ImTui::TScreen::~TScreen(unaff_retaddr);
    operator_delete(pTVar1,0x18);
  }
  g_screen = (TScreen *)0x0;
  return;
}

Assistant:

void ImTui_ImplNcurses_Shutdown() {
    // ref #11 : https://github.com/ggerganov/imtui/issues/11
    printf("\033[?1003l\n"); // Disable mouse movement events, as l = low

    endwin();

    if (g_screen) {
        delete g_screen;
    }

    g_screen = nullptr;
}